

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

TPZFMatrix<float> * __thiscall TPZFMatrix<float>::operator+(TPZFMatrix<float> *this,float value)

{
  float *pfVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZFMatrix<float> *in_RSI;
  TPZFMatrix<float> *in_RDI;
  float in_XMM0_Da;
  float *dstlast;
  float *dst;
  int64_t size;
  TPZFMatrix<float> *res;
  float *local_38;
  uint3 in_stack_ffffffffffffffe8;
  
  TPZFMatrix(in_RSI,(TPZFMatrix<float> *)CONCAT44(in_XMM0_Da,(uint)in_stack_ffffffffffffffe8));
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
  iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  pfVar1 = in_RDI->fElem;
  local_38 = pfVar1;
  while (local_38 < pfVar1 + iVar2 * iVar3) {
    *local_38 = in_XMM0_Da + *local_38;
    local_38 = local_38 + 1;
  }
  return in_RDI;
}

Assistant:

TPZFMatrix<TVar> TPZFMatrix<TVar>::operator+(const TVar value ) const {
    TPZFMatrix<TVar> res( *this );
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    
    TVar * dst = res.fElem,  *dstlast = dst+size;
    while ( dst < dstlast )
        *dst++ += value;
    
    return( res );
}